

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O0

Expression * __thiscall hdc::Parser::parse_logical_and_expression(Parser *this)

{
  bool bVar1;
  reference pTVar2;
  Expression *pEVar3;
  Expression *pEVar4;
  Expression *local_48;
  Expression *expression;
  Token oper;
  Parser *this_local;
  
  oper._40_8_ = this;
  Token::Token((Token *)&expression);
  local_48 = parse_equality_expression(this);
  while( true ) {
    while (bVar1 = match(this,TK_AND), bVar1) {
      pTVar2 = __gnu_cxx::
               __normal_iterator<hdc::Token_*,_std::vector<hdc::Token,_std::allocator<hdc::Token>_>_>
               ::operator*(&this->matched);
      Token::operator=((Token *)&expression,pTVar2);
      pEVar3 = (Expression *)operator_new(0x68);
      pEVar4 = parse_equality_expression(this);
      LogicalAndExpression::LogicalAndExpression
                ((LogicalAndExpression *)pEVar3,(Token *)&expression,local_48,pEVar4);
      local_48 = pEVar3;
    }
    bVar1 = match(this,TK_LOGICAL_AND);
    if (!bVar1) break;
    pTVar2 = __gnu_cxx::
             __normal_iterator<hdc::Token_*,_std::vector<hdc::Token,_std::allocator<hdc::Token>_>_>
             ::operator*(&this->matched);
    Token::operator=((Token *)&expression,pTVar2);
    pEVar3 = (Expression *)operator_new(0x68);
    pEVar4 = parse_equality_expression(this);
    LogicalAndExpression::LogicalAndExpression
              ((LogicalAndExpression *)pEVar3,(Token *)&expression,local_48,pEVar4);
    local_48 = pEVar3;
  }
  Token::~Token((Token *)&expression);
  return local_48;
}

Assistant:

Expression* Parser::parse_logical_and_expression() {
    Token oper;
    Expression* expression = parse_equality_expression();

    while (true) {
        if (match(TK_AND)) {
            oper = *matched;
            expression = new LogicalAndExpression(oper, expression, parse_equality_expression());
        } else if (match(TK_LOGICAL_AND)) {
            oper = *matched;
            expression = new LogicalAndExpression(oper, expression, parse_equality_expression());
        } else {
            break;
        }
    }

    return expression;
}